

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::save_resume_data(torrent *this,resume_data_flags_t flags)

{
  bool bVar1;
  int iVar2;
  storage_index_t sVar3;
  alert_manager *paVar4;
  undefined4 extraout_var;
  bool local_429;
  byte local_411;
  undefined1 local_3f8 [32];
  add_torrent_params atp;
  bitfield_flag local_66;
  bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void> local_65;
  error_code_enum local_64;
  undefined1 local_60 [24];
  undefined1 local_48 [19];
  bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void> conditions;
  error_code_enum local_2c;
  undefined1 local_28 [24];
  torrent *this_local;
  resume_data_flags_t flags_local;
  
  local_28._16_8_ = this;
  this_local._7_1_ = flags.m_val;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    local_48[5] = '\b';
    local_48[4] = '\x10';
    local_48[10] = flags.m_val;
    local_48[6] = libtorrent::flags::operator|
                            ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             '\b',(bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>
                                   )'\x10');
    local_48[3] = ' ';
    local_48[7] = libtorrent::flags::operator|
                            ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             local_48[6],
                             (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             ' ');
    local_48[2] = '@';
    local_48[8] = libtorrent::flags::operator|
                            ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             local_48[7],
                             (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             '@');
    local_48[1] = 0x80;
    local_48[9] = libtorrent::flags::operator|
                            ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             local_48[8],
                             (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                             0x80);
    local_48[0xb] =
         libtorrent::flags::operator&
                   ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                    local_48[10],
                    (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                    local_48[9]);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                      ((bitfield_flag *)(local_48 + 0xb));
    local_411 = 0;
    if (bVar1) {
      local_60[0x17] = (this->m_need_save_resume_data).m_val;
      local_60[0x16] = local_48[0xb];
      local_48[0] = libtorrent::flags::operator&
                              (local_60[0x17],
                               (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>
                                )local_48[0xb]);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)local_48);
      local_411 = bVar1 ^ 0xff;
    }
    if ((local_411 & 1) == 0) {
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>::
      bitfield_flag(&local_65);
      (this->m_need_save_resume_data).m_val = local_65.m_val;
      state_updated(this);
      local_66 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                            this_local._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::resume_data_flags_tag,_void>)
                            '\x01');
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_66);
      local_429 = false;
      if (bVar1) {
        local_429 = storage_holder::operator_cast_to_bool(&this->m_storage);
      }
      if (local_429 != false) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        sVar3 = storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
        ::std::function<void_()>::function((function<void_()> *)&atp.creation_date);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                  ((long *)CONCAT44(extraout_var,iVar2),sVar3.m_val,&atp.creation_date);
        ::std::function<void_()>::~function((function<void_()> *)&atp.creation_date);
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      state_updated(this);
      add_torrent_params::add_torrent_params((add_torrent_params *)(local_3f8 + 0x18));
      local_3f8[0x17] = this_local._7_1_;
      write_resume_data(this,this_local._7_1_,(add_torrent_params *)(local_3f8 + 0x18));
      paVar4 = alerts(this);
      get_handle((torrent *)local_3f8);
      alert_manager::
      emplace_alert<libtorrent::save_resume_data_alert,libtorrent::add_torrent_params,libtorrent::torrent_handle>
                (paVar4,(add_torrent_params *)(local_3f8 + 0x18),(torrent_handle *)local_3f8);
      torrent_handle::~torrent_handle((torrent_handle *)local_3f8);
      add_torrent_params::~add_torrent_params((add_torrent_params *)(local_3f8 + 0x18));
    }
    else {
      paVar4 = alerts(this);
      get_handle((torrent *)local_60);
      local_64 = resume_data_not_modified;
      alert_manager::
      emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                (paVar4,(torrent_handle *)local_60,&local_64);
      torrent_handle::~torrent_handle((torrent_handle *)local_60);
    }
  }
  else {
    paVar4 = alerts(this);
    get_handle((torrent *)local_28);
    local_2c = torrent_removed;
    alert_manager::
    emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
              (paVar4,(torrent_handle *)local_28,&local_2c);
    torrent_handle::~torrent_handle((torrent_handle *)local_28);
  }
  return;
}

Assistant:

void torrent::save_resume_data(resume_data_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::torrent_removed);
			return;
		}

		auto conditions = flags & (
			torrent_handle::if_counters_changed
			| torrent_handle::if_download_progress
			| torrent_handle::if_config_changed
			| torrent_handle::if_state_changed
			| torrent_handle::if_metadata_changed
			);

		if (conditions && !(m_need_save_resume_data & conditions))
		{
			// if conditions were specified, but none of those conditions are
			// met (i.e. none of them have been updated since last
			// save_resume_data()), we don't save it.
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::resume_data_not_modified);
			return;
		}

		m_need_save_resume_data = resume_data_flags_t{};
		state_updated();

		if ((flags & torrent_handle::flush_disk_cache) && m_storage)
		{
			m_ses.disk_thread().async_release_files(m_storage);
			m_ses.deferred_submit_jobs();
		}

		state_updated();

		add_torrent_params atp;
		write_resume_data(flags, atp);
		alerts().emplace_alert<save_resume_data_alert>(std::move(atp), get_handle());
	}